

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deps_log.cc
# Opt level: O2

LoadStatus __thiscall DepsLog::Load(DepsLog *this,string *path,State *state,string *err)

{
  pointer ppNVar1;
  Node *pNVar2;
  Metrics *this_00;
  bool bVar3;
  int iVar4;
  FILE *__stream;
  char *pcVar5;
  size_t sVar6;
  size_t size;
  Deps *this_01;
  ulong uVar7;
  int *piVar8;
  Metric *pMVar9;
  LoadStatus LVar10;
  uint uVar11;
  uint uVar12;
  string *err_00;
  StringPiece path_00;
  int version;
  int iStack_80084;
  string *psStack_80080;
  ulong uStack_80078;
  uint uStack_8006c;
  string *psStack_80068;
  State *pSStack_80060;
  vector<Node_*,_std::allocator<Node_*>_> *pvStack_80058;
  Node *node;
  ScopedMetric metrics_h_scoped;
  char buf [524288];
  
  psStack_80080 = err;
  if ((Load(std::__cxx11::string_const&,State*,std::__cxx11::string*)::metrics_h_metric == '\0') &&
     (iVar4 = __cxa_guard_acquire(&Load(std::__cxx11::string_const&,State*,std::__cxx11::string*)::
                                   metrics_h_metric), this_00 = g_metrics, iVar4 != 0)) {
    if (g_metrics == (Metrics *)0x0) {
      pMVar9 = (Metric *)0x0;
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)buf,".ninja_deps load",(allocator<char> *)&metrics_h_scoped);
      pMVar9 = Metrics::NewMetric(this_00,(string *)buf);
      std::__cxx11::string::~string((string *)buf);
    }
    Load::metrics_h_metric = pMVar9;
    __cxa_guard_release(&Load(std::__cxx11::string_const&,State*,std::__cxx11::string*)::
                         metrics_h_metric);
  }
  ScopedMetric::ScopedMetric(&metrics_h_scoped,Load::metrics_h_metric);
  psStack_80068 = path;
  __stream = fopen((path->_M_dataplus)._M_p,"rb");
  if (__stream == (FILE *)0x0) {
    piVar8 = __errno_location();
    if (*piVar8 == 2) {
      LVar10 = LOAD_NOT_FOUND;
    }
    else {
      strerror(*piVar8);
      LVar10 = LOAD_ERROR;
      std::__cxx11::string::assign((char *)psStack_80080);
    }
    goto LAB_0016c1c5;
  }
  version = 0;
  pcVar5 = fgets(buf,0x80000,__stream);
  if (((pcVar5 == (char *)0x0) || (sVar6 = fread(&version,4,1,__stream), sVar6 == 0)) ||
     (iVar4 = bcmp(buf,"# ninjadeps\n",0xd), version != 4 || iVar4 != 0)) {
    std::__cxx11::string::assign((char *)psStack_80080);
    fclose(__stream);
    unlink((psStack_80068->_M_dataplus)._M_p);
  }
  else {
    pvStack_80058 = &this->nodes_;
    iStack_80084 = 0;
    uStack_80078 = 0;
    pSStack_80060 = state;
    while( true ) {
      size = ftell(__stream);
      sVar6 = fread(&uStack_8006c,4,1,__stream);
      uVar12 = uStack_8006c;
      if (sVar6 == 0) break;
      uVar11 = uStack_8006c & 0x7fffffff;
      if ((0x7ffff < uVar11) || (sVar6 = fread(buf,(ulong)uVar11,1,__stream), sVar6 == 0))
      goto LAB_0016c218;
      if ((int)uVar12 < 0) {
        if ((uVar12 & 3) != 0) {
          __assert_fail("size % 4 == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log.cc"
                        ,0xce,"LoadStatus DepsLog::Load(const string &, State *, string *)");
        }
        this_01 = (Deps *)operator_new(0x18);
        uVar12 = (uVar11 >> 2) - 3;
        Deps::Deps(this_01,buf._4_8_,uVar12);
        if ((int)uVar12 < 1) {
          uVar12 = 0;
        }
        for (uVar7 = 0; uVar12 != uVar7; uVar7 = uVar7 + 1) {
          ppNVar1 = (this->nodes_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          if ((int)((ulong)((long)(this->nodes_).super__Vector_base<Node_*,_std::allocator<Node_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)ppNVar1) >> 3)
              <= *(int *)(buf + uVar7 * 4 + 0xc)) {
            __assert_fail("deps_data[i] < (int)nodes_.size()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log.cc"
                          ,0xd9,"LoadStatus DepsLog::Load(const string &, State *, string *)");
          }
          pNVar2 = ppNVar1[*(int *)(buf + uVar7 * 4 + 0xc)];
          if (pNVar2 == (Node *)0x0) {
            __assert_fail("nodes_[deps_data[i]]",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log.cc"
                          ,0xda,"LoadStatus DepsLog::Load(const string &, State *, string *)");
          }
          this_01->nodes[uVar7] = pNVar2;
        }
        bVar3 = UpdateDeps(this,buf._0_4_,this_01);
        iStack_80084 = iStack_80084 + 1;
        uStack_80078 = (ulong)((int)uStack_80078 + (uint)!bVar3);
        state = pSStack_80060;
      }
      else {
        if (uVar11 < 5) {
          __assert_fail("path_size > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log.cc"
                        ,0xe3,"LoadStatus DepsLog::Load(const string &, State *, string *)");
        }
        uVar12 = uVar11 - 4;
        if (buf[uVar11 - 5] == '\0') {
          uVar12 = uVar11 - 5;
        }
        if (buf[(long)(int)uVar12 + -1] == '\0') {
          uVar12 = uVar12 - 1;
        }
        if (buf[(long)(int)uVar12 + -1] == '\0') {
          uVar12 = uVar12 - 1;
        }
        path_00.len_ = (size_t)(int)uVar12;
        path_00.str_ = buf;
        node = State::GetNode(state,path_00,0);
        uVar12 = (uint)((ulong)((long)(this->nodes_).
                                      super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                      super__Vector_impl_data._M_finish -
                               (long)(this->nodes_).
                                     super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                     super__Vector_impl_data._M_start) >> 3);
        if ((*(uint *)(buf + ((ulong)uVar11 - 4)) ^ uVar12) != 0xffffffff) goto LAB_0016c218;
        if (-1 < node->id_) {
          __assert_fail("node->id() < 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log.cc"
                        ,0xfc,"LoadStatus DepsLog::Load(const string &, State *, string *)");
        }
        node->id_ = uVar12;
        std::vector<Node_*,_std::allocator<Node_*>_>::push_back(pvStack_80058,&node);
      }
    }
    iVar4 = feof(__stream);
    if (iVar4 != 0) {
      fclose(__stream);
      LVar10 = LOAD_SUCCESS;
      if ((1000 < iStack_80084) && ((int)uStack_80078 * 3 < iStack_80084)) {
        this->needs_recompaction_ = true;
      }
      goto LAB_0016c1c5;
    }
LAB_0016c218:
    iVar4 = ferror(__stream);
    err_00 = psStack_80080;
    if (iVar4 == 0) {
      std::__cxx11::string::assign((char *)psStack_80080);
    }
    else {
      strerror(iVar4);
      err_00 = psStack_80080;
      std::__cxx11::string::assign((char *)psStack_80080);
    }
    fclose(__stream);
    bVar3 = Truncate(psStack_80068,size,err_00);
    LVar10 = LOAD_ERROR;
    if (!bVar3) goto LAB_0016c1c5;
    std::__cxx11::string::append((char *)err_00);
  }
  LVar10 = LOAD_SUCCESS;
LAB_0016c1c5:
  ScopedMetric::~ScopedMetric(&metrics_h_scoped);
  return LVar10;
}

Assistant:

LoadStatus DepsLog::Load(const string& path, State* state, string* err) {
  METRIC_RECORD(".ninja_deps load");
  char buf[kMaxRecordSize + 1];
  FILE* f = fopen(path.c_str(), "rb");
  if (!f) {
    if (errno == ENOENT)
      return LOAD_NOT_FOUND;
    *err = strerror(errno);
    return LOAD_ERROR;
  }

  bool valid_header = true;
  int version = 0;
  if (!fgets(buf, sizeof(buf), f) || fread(&version, 4, 1, f) < 1)
    valid_header = false;
  // Note: For version differences, this should migrate to the new format.
  // But the v1 format could sometimes (rarely) end up with invalid data, so
  // don't migrate v1 to v3 to force a rebuild. (v2 only existed for a few days,
  // and there was no release with it, so pretend that it never happened.)
  if (!valid_header || strcmp(buf, kFileSignature) != 0 ||
      version != kCurrentVersion) {
    if (version == 1)
      *err = "deps log version change; rebuilding";
    else
      *err = "bad deps log signature or version; starting over";
    fclose(f);
    unlink(path.c_str());
    // Don't report this as a failure.  An empty deps log will cause
    // us to rebuild the outputs anyway.
    return LOAD_SUCCESS;
  }

  long offset;
  bool read_failed = false;
  int unique_dep_record_count = 0;
  int total_dep_record_count = 0;
  for (;;) {
    offset = ftell(f);

    unsigned size;
    if (fread(&size, 4, 1, f) < 1) {
      if (!feof(f))
        read_failed = true;
      break;
    }
    bool is_deps = (size >> 31) != 0;
    size = size & 0x7FFFFFFF;

    if (size > kMaxRecordSize || fread(buf, size, 1, f) < 1) {
      read_failed = true;
      break;
    }

    if (is_deps) {
      assert(size % 4 == 0);
      int* deps_data = reinterpret_cast<int*>(buf);
      int out_id = deps_data[0];
      TimeStamp mtime;
      mtime = (TimeStamp)(((uint64_t)(unsigned int)deps_data[2] << 32) |
                          (uint64_t)(unsigned int)deps_data[1]);
      deps_data += 3;
      int deps_count = (size / 4) - 3;

      Deps* deps = new Deps(mtime, deps_count);
      for (int i = 0; i < deps_count; ++i) {
        assert(deps_data[i] < (int)nodes_.size());
        assert(nodes_[deps_data[i]]);
        deps->nodes[i] = nodes_[deps_data[i]];
      }

      total_dep_record_count++;
      if (!UpdateDeps(out_id, deps))
        ++unique_dep_record_count;
    } else {
      int path_size = size - 4;
      assert(path_size > 0);  // CanonicalizePath() rejects empty paths.
      // There can be up to 3 bytes of padding.
      if (buf[path_size - 1] == '\0') --path_size;
      if (buf[path_size - 1] == '\0') --path_size;
      if (buf[path_size - 1] == '\0') --path_size;
      StringPiece subpath(buf, path_size);
      // It is not necessary to pass in a correct slash_bits here. It will
      // either be a Node that's in the manifest (in which case it will already
      // have a correct slash_bits that GetNode will look up), or it is an
      // implicit dependency from a .d which does not affect the build command
      // (and so need not have its slashes maintained).
      Node* node = state->GetNode(subpath, 0);

      // Check that the expected index matches the actual index. This can only
      // happen if two ninja processes write to the same deps log concurrently.
      // (This uses unary complement to make the checksum look less like a
      // dependency record entry.)
      unsigned checksum = *reinterpret_cast<unsigned*>(buf + size - 4);
      int expected_id = ~checksum;
      int id = nodes_.size();
      if (id != expected_id) {
        read_failed = true;
        break;
      }

      assert(node->id() < 0);
      node->set_id(id);
      nodes_.push_back(node);
    }
  }

  if (read_failed) {
    // An error occurred while loading; try to recover by truncating the
    // file to the last fully-read record.
    if (ferror(f)) {
      *err = strerror(ferror(f));
    } else {
      *err = "premature end of file";
    }
    fclose(f);

    if (!Truncate(path, offset, err))
      return LOAD_ERROR;

    // The truncate succeeded; we'll just report the load error as a
    // warning because the build can proceed.
    *err += "; recovering";
    return LOAD_SUCCESS;
  }

  fclose(f);

  // Rebuild the log if there are too many dead records.
  int kMinCompactionEntryCount = 1000;
  int kCompactionRatio = 3;
  if (total_dep_record_count > kMinCompactionEntryCount &&
      total_dep_record_count > unique_dep_record_count * kCompactionRatio) {
    needs_recompaction_ = true;
  }

  return LOAD_SUCCESS;
}